

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_56da43::RSTFormatter::EndBlock(RSTFormatter *this)

{
  reference pvVar1;
  long in_RDI;
  
  pvVar1 = std::stack<int,_std::deque<int,_std::allocator<int>_>_>::top
                     ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)0x6ebb3c);
  *(value_type *)(in_RDI + 0x70) = *pvVar1;
  std::stack<int,_std::deque<int,_std::allocator<int>_>_>::pop
            ((stack<int,_std::deque<int,_std::allocator<int>_>_> *)0x6ebb4f);
  *(undefined1 *)(in_RDI + 0x78) = 1;
  return;
}

Assistant:

void RSTFormatter::EndBlock() {
  indent_ = indents_.top();
  indents_.pop();
  end_block_ = true;
}